

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O3

int fe_copy_from_prespch(fe_t *fe,int32 *inout_nframes,mfcc_t **buf_cep,int outidx)

{
  int iVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)outidx;
  if (0 < *inout_nframes) {
    uVar2 = (ulong)outidx;
    do {
      iVar1 = fe_prespch_read_cep(fe->vad_data->prespch_buf,buf_cep[uVar2]);
      if (iVar1 < 1) break;
      uVar2 = uVar2 + 1;
      iVar1 = *inout_nframes;
      *inout_nframes = iVar1 + -1;
    } while (1 < iVar1);
  }
  return (int)uVar2;
}

Assistant:

static int
fe_copy_from_prespch(fe_t *fe, int32 *inout_nframes, mfcc_t **buf_cep, int outidx)
{
    while ((*inout_nframes) > 0 && fe_prespch_read_cep(fe->vad_data->prespch_buf, buf_cep[outidx]) > 0) {
	    outidx++;
    	    (*inout_nframes)--;
    }
    return outidx;    
}